

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  char *pcVar3;
  CountExpr CVar4;
  int iVar5;
  NumberOfArgHandler args;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
LAB_00112472:
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    goto LAB_00112490;
  case PLTERM:
    iVar5 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (iVar5 < 2) {
      local_38 = 0;
      uStack_30 = 0;
      local_20.types_ = 0;
      local_20.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139f33,&local_20);
    }
    else {
      iVar5 = iVar5 + -1;
      do {
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadConstant(this,*pcVar3);
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadConstant(this,*pcVar3);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadConstant(this,*pcVar3);
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_0011242f_caseD_29:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139f5b,&local_20);
    break;
  case FIRST_ITERATED:
    iVar5 = ReadNumArgs(this,1);
    if (0 < iVar5) {
      do {
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case SUM:
    iVar5 = ReadNumArgs(this,3);
    if (0 < iVar5) {
      do {
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case LAST_ITERATED:
    iVar5 = ReadNumArgs(this,1);
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<DimensionPrinter>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<DimensionPrinter>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<DimensionPrinter>>
                *)this,iVar5 + -1,(ArgHandler *)&local_38);
    break;
  case NUMBEROF_SYM:
    iVar5 = ReadNumArgs(this,1);
    ReadSymbolicExpr(this);
    if (1 < iVar5) {
      iVar5 = iVar5 + -1;
      do {
        ReadSymbolicExpr(this);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case COUNT:
    CVar4 = ReadCountExpr(this);
    return CVar4;
  default:
    if (KVar1 == ADD) goto LAB_00112472;
    if (KVar1 != FIRST_UNARY) goto switchD_0011242f_caseD_29;
LAB_00112490:
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
  }
  return 0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}